

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O0

void SQCompilation::SQCompilationContext::resetConfig(void)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe620;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffe628;
  allocator<char> *in_stack_ffffffffffffe640;
  char *in_stack_ffffffffffffe648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe650;
  string *local_17d8;
  string *local_1680;
  string *local_15e8;
  string *local_15c0;
  string *local_14e8;
  string *local_14b0;
  string *local_13e8;
  string *local_13a0;
  string *local_1348;
  string *local_1270;
  string *local_1238;
  string *local_1100;
  string *local_1048;
  allocator<char> local_fcc;
  allocator<char> local_fcb;
  allocator<char> local_fca;
  allocator<char> local_fc9;
  allocator<char> local_fc8;
  allocator<char> local_fc7;
  allocator<char> local_fc6;
  allocator<char> local_fc5;
  allocator<char> local_fc4;
  allocator<char> local_fc3;
  allocator<char> local_fc2;
  allocator<char> local_fc1;
  allocator<char> local_fc0;
  allocator<char> local_fbf;
  allocator<char> local_fbe;
  allocator<char> local_fbd;
  allocator<char> local_fbc;
  allocator<char> local_fbb;
  allocator<char> local_fba;
  allocator<char> local_fb9;
  string *local_fb8;
  string local_fb0 [32];
  undefined1 local_f90 [32];
  undefined1 local_f70 [32];
  undefined1 local_f50 [32];
  undefined1 local_f30 [32];
  undefined1 local_f10 [32];
  undefined1 local_ef0 [32];
  undefined1 local_ed0 [32];
  undefined1 local_eb0 [32];
  undefined1 local_e90 [32];
  undefined1 local_e70 [32];
  undefined1 local_e50 [32];
  undefined1 local_e30 [32];
  undefined1 local_e10 [32];
  undefined1 local_df0 [32];
  undefined1 local_dd0 [32];
  undefined1 local_db0 [32];
  undefined1 local_d90 [32];
  undefined1 local_d70 [32];
  undefined1 local_d50 [32];
  string *local_d30;
  undefined8 local_d28;
  undefined1 local_d19;
  allocator<char> local_d18;
  allocator<char> local_d17;
  allocator<char> local_d16;
  allocator<char> local_d15;
  allocator<char> local_d14;
  allocator<char> local_d13;
  allocator<char> local_d12;
  allocator<char> local_d11;
  string *local_d10;
  string local_d08 [32];
  undefined1 local_ce8 [32];
  undefined1 local_cc8 [32];
  undefined1 local_ca8 [32];
  undefined1 local_c88 [32];
  undefined1 local_c68 [32];
  undefined1 local_c48 [32];
  undefined1 local_c28 [32];
  string *local_c08;
  undefined8 local_c00;
  undefined1 local_bf2;
  allocator<char> local_bf1;
  string *local_bf0;
  string local_be8 [32];
  string *local_bc8;
  undefined8 local_bc0;
  undefined1 local_bb5;
  allocator<char> local_bb4;
  allocator<char> local_bb3;
  allocator<char> local_bb2;
  allocator<char> local_bb1;
  allocator<char> local_bb0;
  allocator<char> local_baf;
  allocator<char> local_bae;
  allocator<char> local_bad;
  allocator<char> local_bac;
  allocator<char> local_bab;
  allocator<char> local_baa;
  allocator<char> local_ba9;
  string *local_ba8;
  string local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  string *local_a20;
  undefined8 local_a18;
  undefined1 local_a0b;
  allocator<char> local_a0a;
  allocator<char> local_a09;
  string *local_a08;
  string local_a00 [32];
  undefined1 local_9e0 [32];
  string *local_9c0;
  undefined8 local_9b8;
  undefined1 local_9ac;
  allocator<char> local_9ab;
  allocator<char> local_9aa;
  allocator<char> local_9a9;
  allocator<char> local_9a8;
  allocator<char> local_9a7;
  allocator<char> local_9a6;
  allocator<char> local_9a5;
  allocator<char> local_9a4;
  allocator<char> local_9a3;
  allocator<char> local_9a2;
  allocator<char> local_9a1;
  string *local_9a0;
  string local_998 [32];
  undefined1 local_978 [32];
  undefined1 local_958 [32];
  undefined1 local_938 [32];
  undefined1 local_918 [32];
  undefined1 local_8f8 [32];
  undefined1 local_8d8 [32];
  undefined1 local_8b8 [32];
  undefined1 local_898 [32];
  undefined1 local_878 [32];
  undefined1 local_858 [32];
  string *local_838;
  undefined8 local_830;
  undefined1 local_824;
  allocator<char> local_823;
  allocator<char> local_822;
  allocator<char> local_821;
  string *local_820;
  string local_818 [32];
  undefined1 local_7f8 [32];
  undefined1 local_7d8 [32];
  string *local_7b8;
  undefined8 local_7b0;
  undefined1 local_7a5;
  allocator<char> local_7a4;
  allocator<char> local_7a3;
  allocator<char> local_7a2;
  allocator<char> local_7a1;
  string *local_7a0;
  string local_798 [32];
  undefined1 local_778 [32];
  undefined1 local_758 [32];
  undefined1 local_738 [32];
  string *local_718;
  undefined8 local_710;
  undefined1 local_705;
  allocator<char> local_704;
  allocator<char> local_703;
  allocator<char> local_702;
  allocator<char> local_701;
  allocator<char> local_700;
  allocator<char> local_6ff;
  allocator<char> local_6fe;
  allocator<char> local_6fd;
  allocator<char> local_6fc;
  allocator<char> local_6fb;
  allocator<char> local_6fa;
  allocator<char> local_6f9;
  string *local_6f8;
  string local_6f0 [32];
  undefined1 local_6d0 [32];
  undefined1 local_6b0 [32];
  undefined1 local_690 [32];
  undefined1 local_670 [32];
  undefined1 local_650 [32];
  undefined1 local_630 [32];
  undefined1 local_610 [32];
  undefined1 local_5f0 [32];
  undefined1 local_5d0 [32];
  undefined1 local_5b0 [32];
  undefined1 local_590 [32];
  string *local_570;
  undefined8 local_568;
  undefined1 local_55b;
  allocator<char> local_55a;
  allocator<char> local_559;
  string *local_558;
  string local_550 [32];
  undefined1 local_530 [32];
  string *local_510;
  undefined8 local_508;
  undefined1 local_4fb;
  allocator<char> local_4fa;
  allocator<char> local_4f9;
  allocator<char> local_4f8;
  allocator<char> local_4f7;
  allocator<char> local_4f6;
  allocator<char> local_4f5;
  allocator<char> local_4f4;
  allocator<char> local_4f3;
  allocator<char> local_4f2;
  allocator<char> local_4f1;
  allocator<char> local_4f0;
  allocator<char> local_4ef;
  allocator<char> local_4ee;
  allocator<char> local_4ed;
  allocator<char> local_4ec;
  allocator<char> local_4eb;
  allocator<char> local_4ea;
  allocator<char> local_4e9;
  string *local_4e8;
  string local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  string *local_2a0;
  undefined8 local_298;
  undefined1 local_28b;
  allocator<char> local_28a;
  allocator<char> local_289;
  allocator<char> local_288;
  allocator<char> local_287;
  allocator<char> local_286;
  allocator<char> local_285;
  allocator<char> local_284;
  allocator<char> local_283;
  allocator<char> local_282;
  allocator<char> local_281;
  string *local_280;
  string local_278 [32];
  undefined1 local_258 [32];
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  string *local_138;
  undefined8 local_130;
  undefined1 local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  allocator<char> local_120;
  allocator<char> local_11f;
  allocator<char> local_11e;
  allocator<char> local_11d [20];
  allocator<char> local_109;
  string *local_108;
  string local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  undefined1 local_40 [32];
  string *local_20;
  undefined8 local_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  std::
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::initializer_list(&local_10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe628);
  local_123 = 1;
  local_108 = local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_108 = (string *)local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_108 = (string *)local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_108 = (string *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_108 = (string *)local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_108 = (string *)local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_108 = (string *)local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_123 = 0;
  local_20 = local_100;
  local_18 = 7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe628);
  local_1048 = (string *)&local_20;
  do {
    local_1048 = local_1048 + -0x20;
    std::__cxx11::string::~string(local_1048);
  } while (local_1048 != local_100);
  std::allocator<char>::~allocator(&local_122);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::~allocator(&local_120);
  std::allocator<char>::~allocator(&local_11f);
  std::allocator<char>::~allocator(&local_11e);
  std::allocator<char>::~allocator(local_11d);
  std::allocator<char>::~allocator(&local_109);
  local_28b = 1;
  local_280 = local_278;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_280 = (string *)local_258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_280 = (string *)local_238;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_280 = (string *)local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_280 = (string *)local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_280 = (string *)local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_280 = (string *)local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_280 = (string *)local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_280 = (string *)local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_280 = (string *)local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_28b = 0;
  local_138 = local_278;
  local_130 = 10;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe628);
  local_1100 = (string *)&local_138;
  do {
    local_1100 = local_1100 + -0x20;
    std::__cxx11::string::~string(local_1100);
  } while (local_1100 != local_278);
  std::allocator<char>::~allocator(&local_28a);
  std::allocator<char>::~allocator(&local_289);
  std::allocator<char>::~allocator(&local_288);
  std::allocator<char>::~allocator(&local_287);
  std::allocator<char>::~allocator(&local_286);
  std::allocator<char>::~allocator(&local_285);
  std::allocator<char>::~allocator(&local_284);
  std::allocator<char>::~allocator(&local_283);
  std::allocator<char>::~allocator(&local_282);
  std::allocator<char>::~allocator(&local_281);
  local_4fb = 1;
  local_4e8 = local_4e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_4c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_4a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_480;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_460;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_440;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_3c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_3a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_380;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_360;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_340;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_320;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_2e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4e8 = (string *)local_2c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_4fb = 0;
  local_2a0 = local_4e0;
  local_298 = 0x12;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe628);
  local_1238 = (string *)&local_2a0;
  do {
    local_1238 = local_1238 + -0x20;
    std::__cxx11::string::~string(local_1238);
  } while (local_1238 != local_4e0);
  std::allocator<char>::~allocator(&local_4fa);
  std::allocator<char>::~allocator(&local_4f9);
  std::allocator<char>::~allocator(&local_4f8);
  std::allocator<char>::~allocator(&local_4f7);
  std::allocator<char>::~allocator(&local_4f6);
  std::allocator<char>::~allocator(&local_4f5);
  std::allocator<char>::~allocator(&local_4f4);
  std::allocator<char>::~allocator(&local_4f3);
  std::allocator<char>::~allocator(&local_4f2);
  std::allocator<char>::~allocator(&local_4f1);
  std::allocator<char>::~allocator(&local_4f0);
  std::allocator<char>::~allocator(&local_4ef);
  std::allocator<char>::~allocator(&local_4ee);
  std::allocator<char>::~allocator(&local_4ed);
  std::allocator<char>::~allocator(&local_4ec);
  std::allocator<char>::~allocator(&local_4eb);
  std::allocator<char>::~allocator(&local_4ea);
  std::allocator<char>::~allocator(&local_4e9);
  local_55b = 1;
  local_558 = local_550;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_558 = (string *)local_530;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_55b = 0;
  local_510 = local_550;
  local_508 = 2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe628);
  local_1270 = (string *)&local_510;
  do {
    local_1270 = local_1270 + -0x20;
    std::__cxx11::string::~string(local_1270);
  } while (local_1270 != local_550);
  std::allocator<char>::~allocator(&local_55a);
  std::allocator<char>::~allocator(&local_559);
  local_705 = 1;
  local_6f8 = local_6f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_6f8 = (string *)local_6d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_6f8 = (string *)local_6b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_6f8 = (string *)local_690;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_6f8 = (string *)local_670;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_6f8 = (string *)local_650;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_6f8 = (string *)local_630;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_6f8 = (string *)local_610;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_6f8 = (string *)local_5f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_6f8 = (string *)local_5d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_6f8 = (string *)local_5b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_6f8 = (string *)local_590;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_705 = 0;
  local_570 = local_6f0;
  local_568 = 0xc;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe628);
  local_1348 = (string *)&local_570;
  do {
    local_1348 = local_1348 + -0x20;
    std::__cxx11::string::~string(local_1348);
  } while (local_1348 != local_6f0);
  std::allocator<char>::~allocator(&local_704);
  std::allocator<char>::~allocator(&local_703);
  std::allocator<char>::~allocator(&local_702);
  std::allocator<char>::~allocator(&local_701);
  std::allocator<char>::~allocator(&local_700);
  std::allocator<char>::~allocator(&local_6ff);
  std::allocator<char>::~allocator(&local_6fe);
  std::allocator<char>::~allocator(&local_6fd);
  std::allocator<char>::~allocator(&local_6fc);
  std::allocator<char>::~allocator(&local_6fb);
  std::allocator<char>::~allocator(&local_6fa);
  std::allocator<char>::~allocator(&local_6f9);
  local_7a5 = 1;
  local_7a0 = local_798;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_7a0 = (string *)local_778;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_7a0 = (string *)local_758;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_7a0 = (string *)local_738;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_7a5 = 0;
  local_718 = local_798;
  local_710 = 4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe628);
  local_13a0 = (string *)&local_718;
  do {
    local_13a0 = local_13a0 + -0x20;
    std::__cxx11::string::~string(local_13a0);
  } while (local_13a0 != local_798);
  std::allocator<char>::~allocator(&local_7a4);
  std::allocator<char>::~allocator(&local_7a3);
  std::allocator<char>::~allocator(&local_7a2);
  std::allocator<char>::~allocator(&local_7a1);
  local_824 = 1;
  local_820 = local_818;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_820 = (string *)local_7f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_820 = (string *)local_7d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_824 = 0;
  local_7b8 = local_818;
  local_7b0 = 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe628);
  local_13e8 = (string *)&local_7b8;
  do {
    local_13e8 = local_13e8 + -0x20;
    std::__cxx11::string::~string(local_13e8);
  } while (local_13e8 != local_818);
  std::allocator<char>::~allocator(&local_823);
  std::allocator<char>::~allocator(&local_822);
  std::allocator<char>::~allocator(&local_821);
  local_9ac = 1;
  local_9a0 = local_998;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_9a0 = (string *)local_978;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_9a0 = (string *)local_958;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_9a0 = (string *)local_938;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_9a0 = (string *)local_918;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_9a0 = (string *)local_8f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_9a0 = (string *)local_8d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_9a0 = (string *)local_8b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_9a0 = (string *)local_898;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_9a0 = (string *)local_878;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_9a0 = (string *)local_858;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_9ac = 0;
  local_838 = local_998;
  local_830 = 0xb;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe628);
  local_14b0 = (string *)&local_838;
  do {
    local_14b0 = local_14b0 + -0x20;
    std::__cxx11::string::~string(local_14b0);
  } while (local_14b0 != local_998);
  std::allocator<char>::~allocator(&local_9ab);
  std::allocator<char>::~allocator(&local_9aa);
  std::allocator<char>::~allocator(&local_9a9);
  std::allocator<char>::~allocator(&local_9a8);
  std::allocator<char>::~allocator(&local_9a7);
  std::allocator<char>::~allocator(&local_9a6);
  std::allocator<char>::~allocator(&local_9a5);
  std::allocator<char>::~allocator(&local_9a4);
  std::allocator<char>::~allocator(&local_9a3);
  std::allocator<char>::~allocator(&local_9a2);
  std::allocator<char>::~allocator(&local_9a1);
  local_a0b = 1;
  local_a08 = local_a00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_a08 = (string *)local_9e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_a0b = 0;
  local_9c0 = local_a00;
  local_9b8 = 2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe628);
  local_14e8 = (string *)&local_9c0;
  do {
    local_14e8 = local_14e8 + -0x20;
    std::__cxx11::string::~string(local_14e8);
  } while (local_14e8 != local_a00);
  std::allocator<char>::~allocator(&local_a0a);
  std::allocator<char>::~allocator(&local_a09);
  local_bb5 = 1;
  local_ba8 = local_ba0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_ba8 = (string *)local_b80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_ba8 = (string *)local_b60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_ba8 = (string *)local_b40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_ba8 = (string *)local_b20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_ba8 = (string *)local_b00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_ba8 = (string *)local_ae0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_ba8 = (string *)local_ac0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_ba8 = (string *)local_aa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_ba8 = (string *)local_a80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_ba8 = (string *)local_a60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_ba8 = (string *)local_a40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_bb5 = 0;
  local_a20 = local_ba0;
  local_a18 = 0xc;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe628);
  local_15c0 = (string *)&local_a20;
  do {
    local_15c0 = local_15c0 + -0x20;
    std::__cxx11::string::~string(local_15c0);
  } while (local_15c0 != local_ba0);
  std::allocator<char>::~allocator(&local_bb4);
  std::allocator<char>::~allocator(&local_bb3);
  std::allocator<char>::~allocator(&local_bb2);
  std::allocator<char>::~allocator(&local_bb1);
  std::allocator<char>::~allocator(&local_bb0);
  std::allocator<char>::~allocator(&local_baf);
  std::allocator<char>::~allocator(&local_bae);
  std::allocator<char>::~allocator(&local_bad);
  std::allocator<char>::~allocator(&local_bac);
  std::allocator<char>::~allocator(&local_bab);
  std::allocator<char>::~allocator(&local_baa);
  std::allocator<char>::~allocator(&local_ba9);
  local_bf2 = 1;
  local_bf0 = local_be8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_bf2 = 0;
  local_bc8 = local_be8;
  local_bc0 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe628);
  local_15e8 = (string *)&local_bc8;
  do {
    local_15e8 = local_15e8 + -0x20;
    std::__cxx11::string::~string(local_15e8);
  } while (local_15e8 != local_be8);
  std::allocator<char>::~allocator(&local_bf1);
  local_d19 = 1;
  local_d10 = local_d08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_d10 = (string *)local_ce8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_d10 = (string *)local_cc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_d10 = (string *)local_ca8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_d10 = (string *)local_c88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_d10 = (string *)local_c68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_d10 = (string *)local_c48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_d10 = (string *)local_c28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_d19 = 0;
  local_c08 = local_d08;
  local_c00 = 8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe628);
  local_1680 = (string *)&local_c08;
  do {
    local_1680 = local_1680 + -0x20;
    std::__cxx11::string::~string(local_1680);
  } while (local_1680 != local_d08);
  std::allocator<char>::~allocator(&local_d18);
  std::allocator<char>::~allocator(&local_d17);
  std::allocator<char>::~allocator(&local_d16);
  std::allocator<char>::~allocator(&local_d15);
  std::allocator<char>::~allocator(&local_d14);
  std::allocator<char>::~allocator(&local_d13);
  std::allocator<char>::~allocator(&local_d12);
  std::allocator<char>::~allocator(&local_d11);
  local_fb8 = local_fb0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_f90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_f70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_f50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_f30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_f10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_ef0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_ed0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_eb0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_e90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_e70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_e50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_e30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_e10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_dd0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_db0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_d90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_d70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_fb8 = (string *)local_d50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  local_d30 = local_fb0;
  local_d28 = 0x14;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe628);
  local_17d8 = (string *)&local_d30;
  do {
    local_17d8 = local_17d8 + -0x20;
    std::__cxx11::string::~string(local_17d8);
  } while (local_17d8 != local_fb0);
  std::allocator<char>::~allocator(&local_fcc);
  std::allocator<char>::~allocator(&local_fcb);
  std::allocator<char>::~allocator(&local_fca);
  std::allocator<char>::~allocator(&local_fc9);
  std::allocator<char>::~allocator(&local_fc8);
  std::allocator<char>::~allocator(&local_fc7);
  std::allocator<char>::~allocator(&local_fc6);
  std::allocator<char>::~allocator(&local_fc5);
  std::allocator<char>::~allocator(&local_fc4);
  std::allocator<char>::~allocator(&local_fc3);
  std::allocator<char>::~allocator(&local_fc2);
  std::allocator<char>::~allocator(&local_fc1);
  std::allocator<char>::~allocator(&local_fc0);
  std::allocator<char>::~allocator(&local_fbf);
  std::allocator<char>::~allocator(&local_fbe);
  std::allocator<char>::~allocator(&local_fbd);
  std::allocator<char>::~allocator(&local_fbc);
  std::allocator<char>::~allocator(&local_fbb);
  std::allocator<char>::~allocator(&local_fba);
  std::allocator<char>::~allocator(&local_fb9);
  return;
}

Assistant:

void SQCompilationContext::resetConfig() {

  function_forbidden = {

  };

  format_function_name = {
    "prn",
    "print",
    "form",
    "fmt",
    "log",
    "dbg",
    "assert",
  };

  function_can_return_string = {
    "subst",
    "concat",
    "tostring",
    "toupper",
    "tolower",
    "slice",
    "trim",
    "join",
    "format",
    "replace"
  };

  function_should_return_bool_prefix = {
    "has",
    "Has",
    "have",
    "Have",
    "should",
    "Should",
    "need",
    "Need",
    "is",
    "Is",
    "was",
    "Was",
    "will",
    "Will",
    "contains",
    "match",
    "startswith",
    "endswith"
  };

  function_should_return_something_prefix = {
    "get",
    "Get"
  };

  function_result_must_be_utilized = {
    "__merge",
    "indexof",
    "findindex",
    "findvalue",
    "len",
    "reduce",
    "tostring",
    "tointeger",
    "tofloat",
    "slice",
    "tolower",
    "toupper"
  };

  function_can_return_null = {
    "indexof",
    "findindex",
    "findvalue",
    "require_optional"
  };

  function_takes_boolean_lambda = {
    "findvalue",
    "findindex",
    "filter"
  };

  function_calls_lambda_inplace = {
    "findvalue",
    "findindex",
    "__update",
    "filter",
    "map",
    "reduce",
    "each",
    "sort",
    "assert",
    "persist",
    "join",
  };

  function_forbidden_parent_dir = {
    "require",
    "require_optional",
  };

  function_modifies_object = {
    "extend",
    "append",
    "__update",
    "insert",
    "apply",
    "clear",
    "sort",
    "reverse",
    "resize",
    "rawdelete",
    "rawset",
    "remove"
  };

  function_must_be_called_from_root = {
    "keepref"
  };

  std_identifier = {
    "require",
    "require_optional",
    "vargv",
    "persist",
    "getclass",
    "__name__",
    "__filename__",
    "keepref",
  };

  std_function = {
    "seterrorhandler",
    "setdebughook",
    "getstackinfos",
    "getroottable",
    "getconsttable",
    "getclass",
    "assert",
    "print",
    "error",
    "compilestring",
    "newthread",
    "suspend",
    "array",
    "type",
    "callee",
    "collectgarbage",
    "resurrectunreachable",
    "min",
    "max",
    "clamp",
  };

}